

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O1

void iutest::detail::PrintToFloatingPoint<float>(floating_point<float> *f,iu_ostream *os)

{
  uint uVar1;
  char cVar2;
  ostream *poVar3;
  size_t sVar4;
  byte bVar5;
  size_t i;
  long lVar6;
  uint uVar7;
  char cVar8;
  iu_stringstream ss;
  char local_1f0 [16];
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  long *local_1c0;
  long local_1b8;
  long local_1b0 [2];
  stringstream local_1a0 [16];
  long local_190;
  undefined8 local_188 [13];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 8;
  std::ostream::_M_insert<double>((double)(f->m_v).fv);
  std::__cxx11::stringbuf::str();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1c0,local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(0x",3);
  uVar1 = (f->m_v).uv;
  local_1f0[0] = '\0';
  local_1f0[1] = '\0';
  local_1f0[2] = '\0';
  local_1f0[3] = '\0';
  local_1f0[4] = '\0';
  local_1f0[5] = '\0';
  local_1f0[6] = '\0';
  local_1f0[7] = '\0';
  bVar5 = 0x1c;
  lVar6 = 0;
  do {
    uVar7 = uVar1 >> (bVar5 & 0x1f) & 0xf;
    cVar2 = (char)uVar7;
    cVar8 = cVar2 + '0';
    if (9 < uVar7) {
      cVar8 = cVar2 + '7';
    }
    local_1f0[lVar6] = cVar8;
    lVar6 = lVar6 + 1;
    bVar5 = bVar5 - 4;
  } while (lVar6 != 8);
  local_1f0[8] = 0;
  local_1e0 = local_1d0;
  sVar4 = strlen(local_1f0);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,local_1f0,local_1f0 + sVar4);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1e0,local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

inline void PrintToFloatingPoint(const floating_point<T>& f, iu_ostream* os)
{
    iu_stringstream ss;
#if IUTEST_HAS_IOMANIP
    ss << ::std::setprecision(::std::numeric_limits<T>::digits10 + 2);
#endif
    UniversalPrint(f.raw(), &ss);
    *os << ss.str() << "(0x" << ToHexString(f.bits()) << ")";
}